

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int addr_eliminable_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  bitmap_t pVVar1;
  VARR_bb_insn_t *pVVar2;
  size_t sVar3;
  FILE *pFVar4;
  gen_ctx *pgVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  ulong uVar8;
  gen_ctx_t pgVar9;
  
  pVVar1 = gen_ctx->temp_bitmap2;
  if ((pVVar1 == (bitmap_t)0x0) || (pVVar1->varr == (bitmap_el_t *)0x0)) {
LAB_00161d3b:
    addr_eliminable_p_cold_5();
  }
  else {
    pVVar1->els_num = 0;
    pVVar2 = gen_ctx->temp_bb_insns2;
    if ((pVVar2 != (VARR_bb_insn_t *)0x0) && (pVVar2->varr != (bb_insn_t_conflict *)0x0)) {
      pVVar2->els_num = 0;
      if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
        if (bb_mem_insns->varr == (bb_insn_t_conflict *)0x0) goto LAB_00161d45;
        bb_mem_insns->els_num = 0;
      }
      pgVar9 = gen_ctx;
      iVar6 = collect_addr_uses(gen_ctx,bb_insn,bb_mem_insns);
      while (pVVar2 = gen_ctx->temp_bb_insns2, pVVar2 != (VARR_bb_insn_t *)0x0) {
        sVar3 = pVVar2->els_num;
        if (sVar3 == 0) {
          return iVar6;
        }
        if (pVVar2->varr == (bb_insn_t_conflict *)0x0) goto LAB_00161d36;
        pVVar2->els_num = sVar3 - 1;
        pgVar9 = gen_ctx;
        iVar7 = collect_addr_uses(gen_ctx,pVVar2->varr[sVar3 - 1],bb_mem_insns);
        if (iVar7 == 0) {
          iVar6 = 0;
        }
      }
      addr_eliminable_p_cold_3();
LAB_00161d36:
      gen_ctx = pgVar9;
      addr_eliminable_p_cold_2();
      goto LAB_00161d3b;
    }
  }
  addr_eliminable_p_cold_4();
LAB_00161d45:
  addr_eliminable_p_cold_1();
  pFVar4 = gen_ctx->debug_file;
  if (pFVar4 == (FILE *)0x0) {
    uVar8 = (ulong)((uint)*(ushort *)((long)&gen_ctx->curr_func_item + 2) * 0x30);
    if (*(gen_ctx_t *)(**(long **)&gen_ctx->optimize_level + 0x20 + uVar8) != gen_ctx) {
      __assert_fail("op_ref->data == ssa_edge",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x965,"void remove_ssa_edge(ssa_edge_t)");
    }
    *(undefined8 *)(**(long **)&gen_ctx->optimize_level + 0x20 + uVar8) =
         *(undefined8 *)&gen_ctx->debug_level;
  }
  else {
    pFVar4->_IO_write_base = *(char **)&gen_ctx->debug_level;
  }
  if (*(long *)&gen_ctx->debug_level != 0) {
    *(FILE **)(*(long *)&gen_ctx->debug_level + 0x18) = pFVar4;
  }
  pgVar5 = gen_ctx->ctx->gen_ctx;
  uVar8 = (ulong)*(uint *)((long)&gen_ctx->curr_func_item + 4);
  if ((gen_ctx_t)pgVar5->call_used_hard_regs[uVar8 * 6 + -9] != gen_ctx) {
    __assert_fail("ssa_edge->use->insn->ops[ssa_edge->use_op_num].data == ssa_edge",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x969,"void remove_ssa_edge(ssa_edge_t)");
  }
  pgVar5->call_used_hard_regs[uVar8 * 6 + -9] = (bitmap_t)0x0;
  free(gen_ctx);
  return extraout_EAX;
}

Assistant:

static int addr_eliminable_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  bitmap_clear (temp_bitmap2);
  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  if (bb_mem_insns != NULL) VARR_TRUNC (bb_insn_t, bb_mem_insns, 0);
  if (!collect_addr_uses (gen_ctx, bb_insn, bb_mem_insns)) res = FALSE;
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn_t copy_bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    if (!collect_addr_uses (gen_ctx, copy_bb_insn, bb_mem_insns)) res = FALSE;
  }
  return res;
}